

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateImageUses
          (ConvertToSampledImagePass *this,Instruction *sampled_image_load)

{
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  reference ppIVar2;
  IRContext *this_01;
  DefUseManager *this_02;
  uint32_t local_a4;
  iterator local_a0;
  undefined8 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  Instruction *local_68;
  Instruction *user;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  Instruction *extracted_image;
  undefined1 local_38 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses_of_load;
  Instruction *sampled_image_load_local;
  ConvertToSampledImagePass *this_local;
  
  uses_of_load.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sampled_image_load;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_38);
  FindUsesOfImage(this,(Instruction *)
                       uses_of_load.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)local_38);
  bVar1 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)local_38);
  if (bVar1) {
    this_local = (ConvertToSampledImagePass *)0x0;
  }
  else {
    this_local = (ConvertToSampledImagePass *)
                 CreateImageExtraction
                           (this,(Instruction *)
                                 uses_of_load.
                                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_38);
    user = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&user), bVar1) {
      ppIVar2 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2);
      this_00 = *ppIVar2;
      local_68 = this_00;
      local_a4 = opt::Instruction::result_id((Instruction *)this_local);
      local_a0 = &local_a4;
      local_98 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_a0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
      opt::Instruction::SetInOperand(this_00,0,&local_90);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
      this_01 = Pass::context(&this->super_Pass);
      this_02 = IRContext::get_def_use_mgr(this_01);
      analysis::DefUseManager::AnalyzeInstUse(this_02,local_68);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2);
    }
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_38);
  return (Instruction *)this_local;
}

Assistant:

Instruction* ConvertToSampledImagePass::UpdateImageUses(
    Instruction* sampled_image_load) {
  std::vector<Instruction*> uses_of_load;
  FindUsesOfImage(sampled_image_load, &uses_of_load);
  if (uses_of_load.empty()) return nullptr;

  auto* extracted_image = CreateImageExtraction(sampled_image_load);
  for (auto* user : uses_of_load) {
    user->SetInOperand(0, {extracted_image->result_id()});
    context()->get_def_use_mgr()->AnalyzeInstUse(user);
  }
  return extracted_image;
}